

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RtMidi.cpp
# Opt level: O0

void __thiscall MidiInApi::setCallback(MidiInApi *this,RtMidiCallback callback,void *userData)

{
  string *psVar1;
  string local_70;
  string local_40;
  void *local_20;
  void *userData_local;
  RtMidiCallback callback_local;
  MidiInApi *this_local;
  
  local_20 = userData;
  userData_local = callback;
  callback_local = (RtMidiCallback)this;
  if (((this->inputData_).usingCallback & 1U) == 0) {
    if (callback == (RtMidiCallback)0x0) {
      psVar1 = &(this->super_MidiApi).errorString_;
      std::__cxx11::string::operator=
                ((string *)psVar1,"RtMidiIn::setCallback: callback function value is invalid!");
      std::__cxx11::string::string((string *)&local_70,(string *)psVar1);
      MidiApi::error(&this->super_MidiApi,WARNING,&local_70);
      std::__cxx11::string::~string((string *)&local_70);
    }
    else {
      (this->inputData_).userCallback = callback;
      (this->inputData_).userData = userData;
      (this->inputData_).usingCallback = true;
    }
  }
  else {
    psVar1 = &(this->super_MidiApi).errorString_;
    std::__cxx11::string::operator=
              ((string *)psVar1,"MidiInApi::setCallback: a callback function is already set!");
    std::__cxx11::string::string((string *)&local_40,(string *)psVar1);
    MidiApi::error(&this->super_MidiApi,WARNING,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
  }
  return;
}

Assistant:

void MidiInApi :: setCallback( RtMidiIn::RtMidiCallback callback, void *userData )
{
  if ( inputData_.usingCallback ) {
    errorString_ = "MidiInApi::setCallback: a callback function is already set!";
    error( RtMidiError::WARNING, errorString_ );
    return;
  }

  if ( !callback ) {
    errorString_ = "RtMidiIn::setCallback: callback function value is invalid!";
    error( RtMidiError::WARNING, errorString_ );
    return;
  }

  inputData_.userCallback = callback;
  inputData_.userData = userData;
  inputData_.usingCallback = true;
}